

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O1

int IPdr_ManSolveInt(Pdr_Man_t *p,int fCheckClauses,int fPushClauses)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  abctime *paVar3;
  Aig_Obj_t *pAVar4;
  _func_int_int_Abc_Cex_t_ptr *p_Var5;
  Vec_Vec_t *pVVar6;
  void *pvVar7;
  _func_int_int *p_Var8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  Aig_Man_t *pAVar17;
  Vec_Int_t *pVVar18;
  int *piVar19;
  Abc_Cex_t *pAVar20;
  Pdr_Par_t *pPVar21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  long lVar25;
  char *pcVar26;
  Pdr_Man_t *pPVar27;
  long lVar28;
  ulong uVar29;
  timespec ts;
  int local_5c;
  long local_58;
  Pdr_Set_t *pCube;
  Abc_Cex_t *local_48;
  ulong local_40;
  long local_38;
  
  pCube = (Pdr_Set_t *)0x0;
  uVar13 = p->pAig->nTruePos;
  if (uVar13 < 2) {
    local_40 = (ulong)uVar13;
  }
  else {
    local_40 = 0;
    uVar13 = uVar13 - 1;
    if (uVar13 != 0) {
      do {
        local_40 = (ulong)((int)local_40 + 1);
        bVar24 = 9 < uVar13;
        uVar13 = uVar13 / 10;
      } while (bVar24);
    }
  }
  iVar10 = clock_gettime(3,(timespec *)&ts);
  if (iVar10 < 0) {
    local_58 = -1;
  }
  else {
    local_58 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  lVar16 = (long)p->pPars->nTimeOut;
  if (lVar16 == 0) {
    lVar22 = 0;
  }
  else {
    iVar10 = clock_gettime(3,(timespec *)&ts);
    if (iVar10 < 0) {
      lVar22 = -1;
    }
    else {
      lVar22 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    lVar22 = lVar22 + lVar16 * 1000000;
  }
  p->timeToStop = lVar22;
  if ((p->pPars->fSolveAll != 0) && (pAVar17 = p->pAig, 0 < pAVar17->nTruePos)) {
    lVar16 = 0;
    do {
      if (pAVar17->vCos->nSize <= lVar16) {
LAB_0090645f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (*(ulong *)((long)pAVar17->vCos->pArray[lVar16] + 8) == ((ulong)pAVar17->pConst1 ^ 1)) {
        pPVar21 = p->pPars;
        if (pPVar21->vOutMap->nSize <= lVar16) {
LAB_00906402:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pPVar21->vOutMap->pArray[lVar16] = 1;
        pPVar21->nProveOuts = pPVar21->nProveOuts + 1;
        if (pPVar21->fUseBridge != 0) {
          Gia_ManToBridgeResult(_stdout,1,(Abc_Cex_t *)0x0,(int)lVar16);
        }
      }
      lVar16 = lVar16 + 1;
      pAVar17 = p->pAig;
    } while (lVar16 < pAVar17->nTruePos);
  }
  iVar12 = 3;
  iVar10 = clock_gettime(3,(timespec *)&ts);
  if (iVar10 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  pPVar21 = p->pPars;
  pPVar21->timeLastSolved = lVar16;
  uVar13 = p->vClauses->nSize;
  if (uVar13 == 0) {
    uVar29 = 0;
    Pdr_ManCreateSolver(p,0);
  }
  else {
    if (fCheckClauses != 0) {
      if (pPVar21->fVerbose != 0) {
        Abc_Print(iVar12,"IPDR: Checking the reloaded length-%d trace...",(ulong)uVar13);
      }
      pPVar27 = p;
      IPdr_ManCheckClauses(p);
      iVar12 = (int)pPVar27;
      if (p->pPars->fVerbose != 0) {
        Abc_Print(iVar12," Passed!\n");
      }
    }
    uVar1 = uVar13 - 1;
    uVar29 = (ulong)uVar1;
    if (fPushClauses != 0) {
      uVar11 = 1;
      if (1 < (int)uVar1) {
        uVar11 = uVar1;
      }
      p->iUseFrame = uVar11;
      if (p->pPars->fVerbose != 0) {
        Abc_Print(iVar12,"IPDR: Pushing the reloaded clauses. Before:\n");
        iVar10 = clock_gettime(3,(timespec *)&ts);
        if (iVar10 < 0) {
          lVar16 = -1;
        }
        else {
          lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        Pdr_ManPrintProgress(p,1,lVar16 - local_58);
      }
      pPVar27 = p;
      iVar10 = Pdr_ManPushClauses(p);
      if (p->pPars->fVerbose != 0) {
        Abc_Print((int)pPVar27,"IPDR: Finished pushing. After:\n");
        iVar12 = clock_gettime(3,(timespec *)&ts);
        if (iVar12 < 0) {
          lVar16 = -1;
        }
        else {
          lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        Pdr_ManPrintProgress(p,1,lVar16 - local_58);
      }
      if (iVar10 != 0) {
        Pdr_ManReportInvariant(p);
        Pdr_ManVerifyInvariant(p);
        return 1;
      }
    }
    if (((p->pPars->fUseAbs != 0) && (1 < (int)uVar13)) && (p->vAbsFlops == (Vec_Int_t *)0x0)) {
      pAVar17 = p->pAig;
      iVar10 = pAVar17->nRegs;
      pVVar18 = (Vec_Int_t *)malloc(0x10);
      iVar12 = 0x10;
      if (0xe < iVar10 - 1U) {
        iVar12 = iVar10;
      }
      pVVar18->nSize = 0;
      pVVar18->nCap = iVar12;
      if (iVar12 == 0) {
        piVar19 = (int *)0x0;
      }
      else {
        piVar19 = (int *)malloc((long)iVar12 << 2);
      }
      pVVar18->pArray = piVar19;
      pVVar18->nSize = iVar10;
      if (piVar19 != (int *)0x0) {
        memset(piVar19,0,(long)iVar10 << 2);
      }
      p->vAbsFlops = pVVar18;
      iVar10 = pAVar17->nRegs;
      pVVar18 = (Vec_Int_t *)malloc(0x10);
      iVar12 = 0x10;
      if (0xe < iVar10 - 1U) {
        iVar12 = iVar10;
      }
      pVVar18->nSize = 0;
      pVVar18->nCap = iVar12;
      if (iVar12 == 0) {
        piVar19 = (int *)0x0;
      }
      else {
        piVar19 = (int *)malloc((long)iVar12 << 2);
      }
      pVVar18->pArray = piVar19;
      pVVar18->nSize = iVar10;
      if (piVar19 != (int *)0x0) {
        memset(piVar19,0xff,(long)iVar10 << 2);
      }
      p->vMapFf2Ppi = pVVar18;
      pVVar18 = (Vec_Int_t *)malloc(0x10);
      pVVar18->nCap = 100;
      pVVar18->nSize = 0;
      piVar19 = (int *)malloc(400);
      pVVar18->pArray = piVar19;
      p->vMapPpi2Ff = pVVar18;
      IPdr_ManRestoreAbsFlops(p);
    }
  }
  local_38 = 0;
  do {
    iVar10 = (int)uVar29;
    if (((p->pPars->fUseAbs != 0) && (p->vAbsFlops == (Vec_Int_t *)0x0)) && (iVar10 == 1)) {
      pAVar17 = p->pAig;
      iVar12 = pAVar17->nRegs;
      pVVar18 = (Vec_Int_t *)malloc(0x10);
      iVar14 = iVar12;
      if (iVar12 - 1U < 0xf) {
        iVar14 = 0x10;
      }
      pVVar18->nSize = 0;
      pVVar18->nCap = iVar14;
      if (iVar14 == 0) {
        piVar19 = (int *)0x0;
      }
      else {
        piVar19 = (int *)malloc((long)iVar14 << 2);
      }
      pVVar18->pArray = piVar19;
      pVVar18->nSize = iVar12;
      if (piVar19 != (int *)0x0) {
        memset(piVar19,0,(long)iVar12 << 2);
      }
      p->vAbsFlops = pVVar18;
      iVar12 = pAVar17->nRegs;
      pVVar18 = (Vec_Int_t *)malloc(0x10);
      iVar14 = iVar12;
      if (iVar12 - 1U < 0xf) {
        iVar14 = 0x10;
      }
      pVVar18->nSize = 0;
      pVVar18->nCap = iVar14;
      if (iVar14 == 0) {
        piVar19 = (int *)0x0;
      }
      else {
        piVar19 = (int *)malloc((long)iVar14 << 2);
      }
      pVVar18->pArray = piVar19;
      pVVar18->nSize = iVar12;
      if (piVar19 != (int *)0x0) {
        memset(piVar19,0xff,(long)iVar12 << 2);
      }
      p->vMapFf2Ppi = pVVar18;
      pVVar18 = (Vec_Int_t *)malloc(0x10);
      pVVar18->nCap = 100;
      pVVar18->nSize = 0;
      piVar19 = (int *)malloc(400);
      pVVar18->pArray = piVar19;
      p->vMapPpi2Ff = pVVar18;
    }
    p->nFrames = iVar10;
    if (iVar10 != p->vSolvers->nSize + -1) {
      __assert_fail("iFrame == Vec_PtrSize(p->vSolvers)-1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                    ,0x1d1,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
    }
    iVar12 = 1;
    if (1 < iVar10) {
      iVar12 = iVar10;
    }
    p->iUseFrame = iVar12;
    p->iOutCur = 0;
    pAVar17 = p->pAig;
    iVar12 = pAVar17->nTruePos;
    bVar24 = 0 < iVar12;
    if (0 < iVar12) {
      uVar13 = 0;
LAB_00905162:
      if (((int)uVar13 < 0) || (pAVar17->vCos->nSize <= (int)uVar13)) goto LAB_0090645f;
      pVVar2 = p->vCexes;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
LAB_009051a2:
        paVar3 = p->pTime4Outs;
        if ((paVar3 == (abctime *)0x0) || (paVar3[uVar13] != 0)) {
          pAVar4 = *(Aig_Obj_t **)((long)pAVar17->vCos->pArray[uVar13] + 8);
          if (pAVar4 != (Aig_Obj_t *)((ulong)pAVar17->pConst1 ^ 1)) {
            if (pAVar4 != pAVar17->pConst1) {
              if (paVar3 != (abctime *)0x0) {
                if (paVar3[uVar13] < 1) {
                  __assert_fail("p->pTime4Outs[p->iOutCur] > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                                ,0x202,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
                }
                iVar12 = clock_gettime(3,(timespec *)&ts);
                lVar16 = -1;
                local_38 = -1;
                if (-1 < iVar12) {
                  local_38 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                lVar22 = p->pTime4Outs[p->iOutCur];
                iVar12 = clock_gettime(3,(timespec *)&ts);
                if (-1 < iVar12) {
                  lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                p->timeToStopOne = lVar16 + lVar22;
              }
              do {
                while( true ) {
                  if ((p->pPars->nTimeOutGap != 0) && (p->pPars->timeLastSolved != 0)) {
                    iVar12 = 3;
                    iVar14 = clock_gettime(3,(timespec *)&ts);
                    if (iVar14 < 0) {
                      lVar16 = -1;
                    }
                    else {
                      lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                    }
                    pPVar21 = p->pPars;
                    if ((long)pPVar21->nTimeOutGap * 1000000 + pPVar21->timeLastSolved < lVar16)
                    goto LAB_0090624c;
                  }
                  pPVar27 = p;
                  iVar14 = Pdr_ManCheckCube(p,iVar10,(Pdr_Set_t *)0x0,&pCube,p->pPars->nConfLimit,0,
                                            1);
                  iVar12 = (int)pPVar27;
                  if (iVar14 != 0) break;
                  pPVar27 = p;
                  iVar15 = Pdr_ManBlockCube(p,pCube);
                  iVar12 = (int)pPVar27;
                  pPVar21 = p->pPars;
                  iVar14 = pPVar21->fVerbose;
                  if (iVar15 == 0) {
                    if ((iVar14 != 0) && (pPVar21->fUseAbs == 0)) {
                      iVar12 = pPVar21->fSolveAll;
                      iVar14 = clock_gettime(3,(timespec *)&ts);
                      if (iVar14 < 0) {
                        lVar16 = -1;
                      }
                      else {
                        lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                      }
                      Pdr_ManPrintProgress(p,(uint)(iVar12 == 0),lVar16 - local_58);
                    }
                    pPVar21 = p->pPars;
                    pPVar21->iFrame = iVar10;
                    if (pPVar21->fSolveAll == 0) {
                      iVar12 = clock_gettime(3,(timespec *)&ts);
                      if (iVar12 < 0) {
                        lVar16 = 1;
                      }
                      else {
                        lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                        lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + ts.tv_sec * -1000000;
                      }
                      local_48 = Pdr_ManDeriveCexAbs(p);
                      iVar12 = clock_gettime(3,(timespec *)&ts);
                      if (iVar12 < 0) {
                        lVar22 = -1;
                      }
                      else {
                        lVar22 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                      }
                      p->tAbs = p->tAbs + lVar22 + lVar16;
                      if (local_48 == (Abc_Cex_t *)0x0) {
                        if (p->pPars->fUseAbs == 0) {
                          __assert_fail("p->pPars->fUseAbs",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                                        ,0x252,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
                        }
                        Pdr_QueueClean(p);
                        pCube = (Pdr_Set_t *)0x0;
                        bVar9 = true;
                        iVar14 = 0xb;
                      }
                      else {
                        p->pAig->pSeqModel = local_48;
                        pPVar21 = p->pPars;
                        bVar9 = false;
                        iVar14 = 1;
                        if ((pPVar21->fVerbose == 0) || (pPVar21->fUseAbs == 0)) {
                          local_5c = 0;
                          iVar14 = 1;
                          bVar9 = false;
                        }
                        else {
                          iVar12 = pPVar21->fSolveAll;
                          iVar15 = clock_gettime(3,(timespec *)&ts);
                          if (iVar15 < 0) {
                            lVar16 = -1;
                          }
                          else {
                            lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                          }
                          Pdr_ManPrintProgress(p,(uint)(iVar12 == 0),lVar16 - local_58);
                          local_5c = 0;
                        }
                      }
                      if (local_48 == (Abc_Cex_t *)0x0) goto LAB_00905960;
                      goto LAB_00906374;
                    }
                    pPVar21->nFailOuts = pPVar21->nFailOuts + 1;
                    if ((pPVar21->fUseBridge == 0) && (pPVar21->fStoreCex == 0)) {
                      pAVar20 = (Abc_Cex_t *)0x1;
                    }
                    else {
                      pAVar20 = Pdr_ManDeriveCex(p);
                    }
                    pPVar21 = p->pPars;
                    pVVar18 = pPVar21->vOutMap;
                    if (pVVar18 != (Vec_Int_t *)0x0) {
                      iVar12 = p->iOutCur;
                      if (((long)iVar12 < 0) || (pVVar18->nSize <= iVar12)) goto LAB_00906402;
                      pVVar18->pArray[iVar12] = 0;
                    }
                    iVar12 = p->iOutCur;
                    if (((long)iVar12 < 0) || (p->vCexes->nSize <= iVar12)) goto LAB_0090645f;
                    if (p->vCexes->pArray[iVar12] != (void *)0x0) {
                      __assert_fail("Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                                    ,0x261,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
                    }
                    if (pPVar21->fUseBridge != 0) {
                      Gia_ManToBridgeResult(_stdout,0,pAVar20,pAVar20->iPo);
                    }
                    iVar12 = p->iOutCur;
                    lVar16 = (long)iVar12;
                    if ((lVar16 < 0) || (p->vCexes->nSize <= iVar12)) goto LAB_0090647e;
                    p->vCexes->pArray[lVar16] = pAVar20;
                    p_Var5 = p->pPars->pFuncOnFail;
                    if (p_Var5 != (_func_int_int_Abc_Cex_t_ptr *)0x0) {
                      if (p->pPars->fStoreCex == 0) {
                        pAVar20 = (Abc_Cex_t *)0x0;
                      }
                      else {
                        if (p->vCexes->nSize <= iVar12) goto LAB_0090645f;
                        pAVar20 = (Abc_Cex_t *)p->vCexes->pArray[lVar16];
                      }
                      iVar14 = (*p_Var5)(iVar12,pAVar20);
                      iVar12 = (int)lVar16;
                      if (iVar14 != 0) goto LAB_009060eb;
                    }
                    if (p->pPars->fNotVerbose == 0) {
                      uVar13 = p->pPars->nFailOuts;
                      Abc_Print(uVar13,
                                "Output %*d was asserted in frame %2d (%2d) (solved %*d out of %*d outputs).\n"
                                ,local_40,(ulong)(uint)p->iOutCur,uVar29 & 0xffffffff,
                                uVar29 & 0xffffffff,local_40,(ulong)uVar13,local_40,
                                (ulong)(uint)p->pAig->nTruePos);
                    }
                    if (p->pPars->nFailOuts != p->pAig->nTruePos) goto LAB_0090594c;
                    goto LAB_00905ecb;
                  }
                  if (iVar15 == -1) goto joined_r0x00905520;
                  if (iVar14 != 0) {
                    iVar12 = clock_gettime(3,(timespec *)&ts);
                    if (iVar12 < 0) {
                      lVar16 = -1;
                    }
                    else {
                      lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                    }
                    Pdr_ManPrintProgress(p,0,lVar16 - local_58);
                  }
                }
                if (iVar14 == 1) goto LAB_0090595d;
              } while (iVar14 != -1);
              iVar14 = p->pPars->fVerbose;
joined_r0x00905520:
              if (iVar14 != 0) {
                iVar12 = clock_gettime(3,(timespec *)&ts);
                if (iVar12 < 0) {
                  lVar16 = -1;
                }
                else {
                  lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                pPVar27 = p;
                Pdr_ManPrintProgress(p,1,lVar16 - local_58);
                iVar12 = (int)pPVar27;
              }
              if (p->timeToStop != 0) {
                iVar12 = 3;
                iVar14 = clock_gettime(3,(timespec *)&ts);
                if (iVar14 < 0) {
                  lVar16 = -1;
                }
                else {
                  lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                if (p->timeToStop < lVar16) goto LAB_00906203;
              }
              if ((p->pPars->nTimeOutGap != 0) && (p->pPars->timeLastSolved != 0)) {
                iVar12 = 3;
                iVar14 = clock_gettime(3,(timespec *)&ts);
                if (iVar14 < 0) {
                  lVar16 = -1;
                }
                else {
                  lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                uVar13 = p->pPars->nTimeOutGap;
                if ((long)(int)uVar13 * 1000000 + p->pPars->timeLastSolved < lVar16) {
                  pcVar26 = "Reached gap timeout (%d seconds) in frame %d.\n";
                  uVar23 = (ulong)uVar13;
                  goto LAB_00906352;
                }
              }
              if (p->timeToStopOne != 0) {
                iVar12 = 3;
                iVar14 = clock_gettime(3,(timespec *)&ts);
                if (iVar14 < 0) {
                  lVar16 = -1;
                }
                else {
                  lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                if (p->timeToStopOne < lVar16) {
LAB_0090594c:
                  Pdr_QueueClean(p);
                  pCube = (Pdr_Set_t *)0x0;
LAB_0090595d:
                  bVar9 = false;
LAB_00905960:
                  if (bVar9) goto LAB_00905bfe;
                  if (p->pTime4Outs != (abctime *)0x0) {
                    iVar14 = 3;
                    iVar12 = clock_gettime(3,(timespec *)&ts);
                    if (iVar12 < 0) {
                      lVar16 = -1;
                    }
                    else {
                      lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                    }
                    iVar12 = p->iOutCur;
                    lVar22 = p->pTime4Outs[iVar12];
                    if (lVar22 < 1) {
                      __assert_fail("p->pTime4Outs[p->iOutCur] > 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                                    ,0x280,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
                    }
                    lVar25 = lVar22 - (lVar16 - local_38);
                    if (lVar25 == 0 || lVar22 < lVar16 - local_38) {
                      lVar25 = 0;
                    }
                    p->pTime4Outs[iVar12] = lVar25;
                    if (lVar25 == 0) {
                      if ((iVar12 < 0) || (p->vCexes->nSize <= iVar12)) goto LAB_0090645f;
                      if (p->vCexes->pArray[iVar12] == (void *)0x0) {
                        pPVar21 = p->pPars;
                        pPVar21->nDropOuts = pPVar21->nDropOuts + 1;
                        pVVar18 = pPVar21->vOutMap;
                        if (pVVar18 != (Vec_Int_t *)0x0) {
                          if (pVVar18->nSize <= iVar12) goto LAB_00906402;
                          pVVar18->pArray[iVar12] = -1;
                        }
                        if (pPVar21->fNotVerbose == 0) {
                          Abc_Print(iVar14,"Timing out on output %*d in frame %d.\n",local_40,
                                    (ulong)(uint)p->iOutCur,uVar29 & 0xffffffff);
                        }
                      }
                    }
                    p->timeToStopOne = 0;
                  }
                  goto LAB_00905a6d;
                }
              }
              uVar13 = p->pPars->nConfLimit;
              uVar23 = (ulong)uVar13;
              if (uVar13 != 0) {
                pcVar26 = "Reached conflict limit (%d) in frame %d.\n";
                goto LAB_00906352;
              }
              if (p->pPars->fVerbose == 0) goto LAB_0090635c;
              pcVar26 = "Computation cancelled by the callback in frame %d.\n";
LAB_009063b2:
              uVar23 = uVar29 & 0xffffffff;
              goto LAB_009063e3;
            }
            pPVar21 = p->pPars;
            if (pPVar21->fSolveAll == 0) {
              pAVar20 = Abc_CexMakeTriv(pAVar17->nRegs,pAVar17->nTruePis,iVar12,
                                        iVar12 * iVar10 + uVar13);
              p->pAig->pSeqModel = pAVar20;
LAB_00905ecb:
              local_5c = 0;
              goto LAB_0090636e;
            }
            if ((pPVar21->fUseBridge == 0) && (pPVar21->fStoreCex == 0)) {
              pAVar20 = (Abc_Cex_t *)0x1;
            }
            else {
              pAVar20 = Abc_CexMakeTriv(pAVar17->nRegs,pAVar17->nTruePis,iVar12,
                                        iVar12 * iVar10 + uVar13);
            }
            pPVar21 = p->pPars;
            pPVar21->nFailOuts = pPVar21->nFailOuts + 1;
            pVVar18 = pPVar21->vOutMap;
            if (pVVar18 != (Vec_Int_t *)0x0) {
              iVar12 = p->iOutCur;
              if (((long)iVar12 < 0) || (pVVar18->nSize <= iVar12)) goto LAB_00906402;
              pVVar18->pArray[iVar12] = 0;
            }
            if (pPVar21->fNotVerbose == 0) {
              Abc_Print(pPVar21->nFailOuts,
                        "Output %*d was trivially asserted in frame %2d (solved %*d out of %*d outputs).\n"
                        ,local_40,(ulong)(uint)p->iOutCur,uVar29 & 0xffffffff,local_40 & 0xffffffff,
                        (ulong)(uint)pPVar21->nFailOuts,local_40,(ulong)(uint)p->pAig->nTruePos);
            }
            iVar12 = p->iOutCur;
            if (((long)iVar12 < 0) || (p->vCexes->nSize <= iVar12)) goto LAB_0090645f;
            if (p->vCexes->pArray[iVar12] != (void *)0x0) {
              __assert_fail("Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                            ,0x1ed,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
            }
            if (p->pPars->fUseBridge != 0) {
              Gia_ManToBridgeResult(_stdout,0,pAVar20,pAVar20->iPo);
            }
            iVar12 = p->iOutCur;
            lVar16 = (long)iVar12;
            if ((lVar16 < 0) || (p->vCexes->nSize <= iVar12)) {
LAB_0090647e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            p->vCexes->pArray[lVar16] = pAVar20;
            p_Var5 = p->pPars->pFuncOnFail;
            if (p_Var5 != (_func_int_int_Abc_Cex_t_ptr *)0x0) {
              if (p->pPars->fStoreCex == 0) {
                pAVar20 = (Abc_Cex_t *)0x0;
              }
              else {
                if (p->vCexes->nSize <= iVar12) goto LAB_0090645f;
                pAVar20 = (Abc_Cex_t *)p->vCexes->pArray[lVar16];
              }
              iVar14 = (*p_Var5)(iVar12,pAVar20);
              iVar12 = (int)lVar16;
              if (iVar14 != 0) {
LAB_009060eb:
                if (p->pPars->fVerbose != 0) {
                  iVar10 = clock_gettime(3,(timespec *)&ts);
                  if (iVar10 < 0) {
                    lVar16 = -1;
                  }
                  else {
                    lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                  }
                  pPVar27 = p;
                  Pdr_ManPrintProgress(p,1,lVar16 - local_58);
                  iVar12 = (int)pPVar27;
                }
                if (p->pPars->fSilent == 0) {
                  pcVar26 = "Quitting due to callback on fail in frame %d.\n";
                  goto LAB_009063b2;
                }
                goto LAB_0090635c;
              }
            }
            iVar12 = p->pPars->nFailOuts;
            if (p->pPars->nDropOuts + iVar12 == p->pAig->nTruePos) {
              local_5c = -(uint)(iVar12 == 0);
              goto LAB_0090636e;
            }
            iVar12 = clock_gettime(3,(timespec *)&ts);
            if (iVar12 < 0) {
              lVar16 = -1;
            }
            else {
              lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            p->pPars->timeLastSolved = lVar16;
          }
        }
      }
      else {
        if (pVVar2->nSize <= (int)uVar13) goto LAB_0090645f;
        if (pVVar2->pArray[uVar13] == (void *)0x0) goto LAB_009051a2;
      }
LAB_00905a6d:
      uVar13 = p->iOutCur + 1;
      p->iOutCur = uVar13;
      pAVar17 = p->pAig;
      iVar12 = pAVar17->nTruePos;
      bVar24 = (int)uVar13 < iVar12;
      if (iVar12 <= (int)uVar13) goto LAB_00905bfe;
      goto LAB_00905162;
    }
LAB_00905bfe:
    if ((p->pPars->fUseAbs != 0) &&
       (pVVar18 = p->vAbsFlops, pVVar18 != (Vec_Int_t *)0x0 && bVar24 == false)) {
      uVar13 = pVVar18->nSize;
      if (pVVar18->nCap < (int)uVar13) {
        if (pVVar18->pArray == (int *)0x0) {
          piVar19 = (int *)malloc((long)(int)uVar13 << 2);
        }
        else {
          piVar19 = (int *)realloc(pVVar18->pArray,(long)(int)uVar13 << 2);
        }
        pVVar18->pArray = piVar19;
        if (piVar19 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar18->nCap = uVar13;
      }
      if (0 < (int)uVar13) {
        memset(pVVar18->pArray,0,(ulong)uVar13 * 4);
      }
      pVVar18->nSize = uVar13;
      pVVar6 = p->vClauses;
      if (0 < pVVar6->nSize) {
        lVar16 = 0;
        do {
          if (pVVar6->nSize <= lVar16) {
LAB_00906440:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                          ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
          }
          pvVar7 = pVVar6->pArray[lVar16];
          lVar22 = 0;
          while (lVar22 < *(int *)((long)pvVar7 + 4)) {
            lVar25 = *(long *)(*(long *)((long)pvVar7 + 8) + lVar22 * 8);
            if (0 < *(int *)(lVar25 + 0x10)) {
              pVVar18 = p->vAbsFlops;
              lVar28 = 0;
              do {
                uVar13 = *(uint *)(lVar25 + 0x14 + lVar28 * 4);
                if ((int)uVar13 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                uVar13 = uVar13 >> 1;
                if (pVVar18->nSize <= (int)uVar13) goto LAB_00906402;
                pVVar18->pArray[uVar13] = 1;
                lVar28 = lVar28 + 1;
              } while (lVar28 < *(int *)(lVar25 + 0x10));
            }
            lVar22 = lVar22 + 1;
            if (pVVar6->nSize <= lVar16) goto LAB_00906440;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < pVVar6->nSize);
      }
    }
    if (p->pPars->fVerbose != 0) {
      iVar12 = clock_gettime(3,(timespec *)&ts);
      if (iVar12 < 0) {
        lVar16 = -1;
      }
      else {
        lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      Pdr_ManPrintProgress(p,(uint)(bVar24 ^ 1),lVar16 - local_58);
    }
    iVar14 = 5;
    if (bVar24 == false) {
      p->nQueLim = p->pPars->nRestLimit;
      if (pCube != (Pdr_Set_t *)0x0) {
        __assert_fail("pCube == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                      ,0x2a8,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
      }
      Pdr_ManSetPropertyOutput(p,iVar10);
      uVar13 = iVar10 + 1;
      uVar29 = (ulong)uVar13;
      Pdr_ManCreateSolver(p,uVar13);
      pPVar27 = p;
      iVar14 = Pdr_ManPushClauses(p);
      iVar12 = (int)pPVar27;
      iVar10 = p->pPars->fVerbose;
      if (iVar14 == 0) {
        if (iVar10 != 0) {
          iVar10 = clock_gettime(3,(timespec *)&ts);
          if (iVar10 < 0) {
            lVar16 = -1;
          }
          else {
            lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          pPVar27 = p;
          Pdr_ManPrintProgress(p,0,lVar16 - local_58);
          iVar12 = (int)pPVar27;
        }
        p_Var8 = p->pPars->pFuncStop;
        if (p_Var8 != (_func_int_int *)0x0) {
          iVar12 = p->pPars->RunId;
          iVar10 = (*p_Var8)(iVar12);
          if (iVar10 != 0) goto LAB_0090635c;
        }
        if (p->timeToStop != 0) {
          iVar12 = 3;
          iVar10 = clock_gettime(3,(timespec *)&ts);
          if (iVar10 < 0) {
            lVar16 = -1;
          }
          else {
            lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          if (p->timeToStop < lVar16) {
            if (p->pPars->fVerbose != 0) {
              iVar10 = clock_gettime(3,(timespec *)&ts);
              if (iVar10 < 0) {
                lVar16 = -1;
              }
              else {
                lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              pPVar27 = p;
              Pdr_ManPrintProgress(p,1,lVar16 - local_58);
              iVar12 = (int)pPVar27;
            }
            pPVar21 = p->pPars;
            if (pPVar21->fSilent == 0) {
LAB_00906348:
              uVar23 = (ulong)(uint)pPVar21->nTimeOut;
              pcVar26 = "Reached timeout (%d seconds) in frame %d.\n";
              goto LAB_00906352;
            }
            goto LAB_0090635c;
          }
        }
        if ((p->pPars->nTimeOutGap != 0) && (p->pPars->timeLastSolved != 0)) {
          iVar12 = 3;
          iVar10 = clock_gettime(3,(timespec *)&ts);
          if (iVar10 < 0) {
            lVar16 = -1;
          }
          else {
            lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          pPVar21 = p->pPars;
          if ((long)pPVar21->nTimeOutGap * 1000000 + pPVar21->timeLastSolved < lVar16) {
LAB_0090624c:
            if (pPVar21->fVerbose != 0) {
              iVar10 = clock_gettime(3,(timespec *)&ts);
              if (iVar10 < 0) {
                lVar16 = -1;
              }
              else {
                lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              pPVar27 = p;
              Pdr_ManPrintProgress(p,1,lVar16 - local_58);
              iVar12 = (int)pPVar27;
            }
            if (p->pPars->fSilent == 0) {
              uVar23 = (ulong)(uint)p->pPars->nTimeOutGap;
              pcVar26 = "Reached gap timeout (%d seconds) in frame %d.\n";
              goto LAB_00906352;
            }
            goto LAB_0090635c;
          }
        }
        iVar10 = p->pPars->nFrameMax;
        iVar14 = 0;
        if ((iVar10 != 0) && (iVar10 <= (int)uVar13)) {
          if (p->pPars->fVerbose != 0) {
            iVar10 = clock_gettime(3,(timespec *)&ts);
            if (iVar10 < 0) {
              lVar16 = -1;
            }
            else {
              lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            pPVar27 = p;
            Pdr_ManPrintProgress(p,1,lVar16 - local_58);
            iVar12 = (int)pPVar27;
          }
          if (p->pPars->fSilent == 0) {
            uVar23 = (ulong)(uint)p->pPars->nFrameMax;
            pcVar26 = "Reached limit on the number of timeframes (%d).\n";
LAB_009063e3:
            Abc_Print(iVar12,pcVar26,uVar23);
          }
          goto LAB_0090635c;
        }
      }
      else if (iVar14 == -1) {
        if (iVar10 != 0) {
          iVar10 = clock_gettime(3,(timespec *)&ts);
          if (iVar10 < 0) {
            lVar16 = -1;
          }
          else {
            lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          pPVar27 = p;
          Pdr_ManPrintProgress(p,1,lVar16 - local_58);
          iVar12 = (int)pPVar27;
        }
        if (p->pPars->fSilent == 0) {
          if (p->timeToStop != 0) {
            iVar12 = 3;
            iVar10 = clock_gettime(3,(timespec *)&ts);
            if (iVar10 < 0) {
              lVar16 = -1;
            }
            else {
              lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            if (p->timeToStop < lVar16) {
LAB_00906203:
              pPVar21 = p->pPars;
              goto LAB_00906348;
            }
          }
          uVar23 = (ulong)(uint)p->pPars->nConfLimit;
          pcVar26 = "Reached conflict limit (%d) in frame.\n";
LAB_00906352:
          Abc_Print(iVar12,pcVar26,uVar23,uVar29 & 0xffffffff);
        }
LAB_0090635c:
        p->pPars->iFrame = (int)uVar29;
        local_5c = -1;
LAB_0090636e:
        iVar14 = 1;
      }
      else {
        if (iVar10 != 0) {
          iVar10 = clock_gettime(3,(timespec *)&ts);
          if (iVar10 < 0) {
            lVar16 = -1;
          }
          else {
            lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          Pdr_ManPrintProgress(p,1,lVar16 - local_58);
        }
        if (p->pPars->fSilent == 0) {
          Pdr_ManReportInvariant(p);
        }
        if (p->pPars->fSilent == 0) {
          Pdr_ManVerifyInvariant(p);
        }
        pPVar21 = p->pPars;
        pPVar21->iFrame = uVar13;
        pPVar21->nProveOuts = p->pAig->nTruePos - (pPVar21->nFailOuts + pPVar21->nDropOuts);
        if (pPVar21->vOutMap != (Vec_Int_t *)0x0) {
          if (p->pAig->nTruePos < 1) {
            uVar29 = 0;
          }
          else {
            uVar29 = 0;
            do {
              pPVar21 = p->pPars;
              pVVar18 = pPVar21->vOutMap;
              if ((long)pVVar18->nSize <= (long)uVar29) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              piVar19 = pVVar18->pArray;
              if ((piVar19[uVar29] == -2) && (piVar19[uVar29] = 1, pPVar21->fUseBridge != 0)) {
                Gia_ManToBridgeResult(_stdout,1,(Abc_Cex_t *)0x0,(int)uVar29);
              }
              uVar29 = uVar29 + 1;
            } while ((long)uVar29 < (long)p->pAig->nTruePos);
          }
        }
        iVar14 = 1;
        if (p->pPars->nProveOuts == p->pAig->nTruePos) {
          local_5c = 1;
        }
        else {
          local_5c = -(uint)(p->pPars->nFailOuts < 1);
        }
      }
    }
LAB_00906374:
    if ((iVar14 != 0) && (iVar14 != 5)) {
      return local_5c;
    }
  } while( true );
}

Assistant:

int IPdr_ManSolveInt( Pdr_Man_t * p, int fCheckClauses, int fPushClauses )
{
    int fPrintClauses = 0;
    Pdr_Set_t * pCube = NULL;
    Aig_Obj_t * pObj;
    Abc_Cex_t * pCexNew;
    int iFrame, RetValue = -1;
    int nOutDigits = Abc_Base10Log( Saig_ManPoNum(p->pAig) );
    abctime clkStart = Abc_Clock(), clkOne = 0;
    p->timeToStop = p->pPars->nTimeOut ? p->pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    // assert( Vec_PtrSize(p->vSolvers) == 0 );
    // in the multi-output mode, mark trivial POs (those fed by const0) as solved 
    if ( p->pPars->fSolveAll )
        Saig_ManForEachPo( p->pAig, pObj, iFrame )
            if ( Aig_ObjChild0(pObj) == Aig_ManConst0(p->pAig) )
            {
                Vec_IntWriteEntry( p->pPars->vOutMap, iFrame, 1 ); // unsat
                p->pPars->nProveOuts++;
                if ( p->pPars->fUseBridge )
                    Gia_ManToBridgeResult( stdout, 1, NULL, iFrame );
            }
    // create the first timeframe
    p->pPars->timeLastSolved = Abc_Clock();

    if ( Vec_VecSize(p->vClauses) == 0 )
        Pdr_ManCreateSolver( p, (iFrame = 0) );
    else {
        iFrame = Vec_VecSize(p->vClauses) - 1;

        if ( fCheckClauses )
        {
            if ( p->pPars->fVerbose )
               Abc_Print( 1, "IPDR: Checking the reloaded length-%d trace...", iFrame + 1 ) ;
            IPdr_ManCheckClauses( p );
            if ( p->pPars->fVerbose )
               Abc_Print( 1, " Passed!\n" ) ;
        }

        if ( fPushClauses )
        {
            p->iUseFrame = Abc_MaxInt(iFrame, 1);

            if ( p->pPars->fVerbose ) 
            {
                Abc_Print( 1, "IPDR: Pushing the reloaded clauses. Before:\n" );
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            }

            RetValue = Pdr_ManPushClauses( p );

            if ( p->pPars->fVerbose ) 
            {
                Abc_Print( 1, "IPDR: Finished pushing. After:\n" );
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            }

            if ( RetValue ) 
            {
                Pdr_ManReportInvariant( p );
                Pdr_ManVerifyInvariant( p );
                return 1;
            }
        }

        if ( p->pPars->fUseAbs && p->vAbsFlops == NULL && iFrame >= 1 )
        {
            assert( p->vAbsFlops == NULL );
            p->vAbsFlops  = Vec_IntStart( Saig_ManRegNum(p->pAig) );
            p->vMapFf2Ppi = Vec_IntStartFull( Saig_ManRegNum(p->pAig) );
            p->vMapPpi2Ff = Vec_IntAlloc( 100 );
            
            IPdr_ManRestoreAbsFlops( p );
        }
 
    }
    while ( 1 )
    {
        int fRefined = 0;
        if ( p->pPars->fUseAbs && p->vAbsFlops == NULL && iFrame == 1 )
        {
//            int i, Prio;
            assert( p->vAbsFlops == NULL );
            p->vAbsFlops  = Vec_IntStart( Saig_ManRegNum(p->pAig) );
            p->vMapFf2Ppi = Vec_IntStartFull( Saig_ManRegNum(p->pAig) );
            p->vMapPpi2Ff = Vec_IntAlloc( 100 );
//            Vec_IntForEachEntry( p->vPrio, Prio, i )
//                if ( Prio >> p->nPrioShift  )
//                    Vec_IntWriteEntry( p->vAbsFlops, i, 1 );
        }
        //if ( p->pPars->fUseAbs && p->vAbsFlops )
        //    printf( "Starting frame %d with %d (%d) flops.\n", iFrame, Vec_IntCountPositive(p->vAbsFlops), Vec_IntCountPositive(p->vPrio) );
        p->nFrames = iFrame;
        assert( iFrame == Vec_PtrSize(p->vSolvers)-1 );
        p->iUseFrame = Abc_MaxInt(iFrame, 1);
        Saig_ManForEachPo( p->pAig, pObj, p->iOutCur )
        {
            // skip disproved outputs
            if ( p->vCexes && Vec_PtrEntry(p->vCexes, p->iOutCur) )
                continue;
            // skip output whose time has run out
            if ( p->pTime4Outs && p->pTime4Outs[p->iOutCur] == 0 )
                continue;
            // check if the output is trivially solved
            if ( Aig_ObjChild0(pObj) == Aig_ManConst0(p->pAig) )
                continue;
            // check if the output is trivially solved
            if ( Aig_ObjChild0(pObj) == Aig_ManConst1(p->pAig) )
            {
                if ( !p->pPars->fSolveAll )
                {
                    pCexNew = Abc_CexMakeTriv( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Saig_ManPoNum(p->pAig), iFrame*Saig_ManPoNum(p->pAig)+p->iOutCur );
                    p->pAig->pSeqModel = pCexNew;
                    return 0; // SAT
                }
                pCexNew = (p->pPars->fUseBridge || p->pPars->fStoreCex) ? Abc_CexMakeTriv( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Saig_ManPoNum(p->pAig), iFrame*Saig_ManPoNum(p->pAig)+p->iOutCur ) : (Abc_Cex_t *)(ABC_PTRINT_T)1;
                p->pPars->nFailOuts++;
                if ( p->pPars->vOutMap ) Vec_IntWriteEntry( p->pPars->vOutMap, p->iOutCur, 0 );
                if ( !p->pPars->fNotVerbose )
                Abc_Print( 1, "Output %*d was trivially asserted in frame %2d (solved %*d out of %*d outputs).\n",
                    nOutDigits, p->iOutCur, iFrame, nOutDigits, p->pPars->nFailOuts, nOutDigits, Saig_ManPoNum(p->pAig) );
                assert( Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL );
                if ( p->pPars->fUseBridge )
                    Gia_ManToBridgeResult( stdout, 0, pCexNew, pCexNew->iPo );
                Vec_PtrWriteEntry( p->vCexes, p->iOutCur, pCexNew );
                if ( p->pPars->pFuncOnFail && p->pPars->pFuncOnFail(p->iOutCur, p->pPars->fStoreCex ? (Abc_Cex_t *)Vec_PtrEntry(p->vCexes, p->iOutCur) : NULL) )
                {
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                    if ( !p->pPars->fSilent )
                        Abc_Print( 1, "Quitting due to callback on fail in frame %d.\n", iFrame );
                    p->pPars->iFrame = iFrame;
                    return -1;
                }
                if ( p->pPars->nFailOuts + p->pPars->nDropOuts == Saig_ManPoNum(p->pAig) )
                    return p->pPars->nFailOuts ? 0 : -1; // SAT or UNDEC
                p->pPars->timeLastSolved = Abc_Clock();
                continue;
            }
            // try to solve this output
            if ( p->pTime4Outs )
            {
                assert( p->pTime4Outs[p->iOutCur] > 0 );
                clkOne = Abc_Clock();
                p->timeToStopOne = p->pTime4Outs[p->iOutCur] + Abc_Clock();
            }
            while ( 1 )
            {
                if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
                {
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                    if ( !p->pPars->fSilent )
                        Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
                    p->pPars->iFrame = iFrame;
                    return -1;
                }
                RetValue = Pdr_ManCheckCube( p, iFrame, NULL, &pCube, p->pPars->nConfLimit, 0, 1 );
                if ( RetValue == 1 )
                    break;
                if ( RetValue == -1 )
                {
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                    if ( p->timeToStop && Abc_Clock() > p->timeToStop )
                        Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
                    else if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
                        Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
                    else if ( p->timeToStopOne && Abc_Clock() > p->timeToStopOne )
                    {
                        Pdr_QueueClean( p );
                        pCube = NULL;
                        break; // keep solving
                    }
                    else if ( p->pPars->nConfLimit )
                        Abc_Print( 1, "Reached conflict limit (%d) in frame %d.\n",  p->pPars->nConfLimit, iFrame );
                    else if ( p->pPars->fVerbose )
                        Abc_Print( 1, "Computation cancelled by the callback in frame %d.\n", iFrame );
                    p->pPars->iFrame = iFrame;
                    return -1;
                }
                if ( RetValue == 0 )
                {
                    RetValue = Pdr_ManBlockCube( p, pCube );
                    if ( RetValue == -1 )
                    {
                        if ( p->pPars->fVerbose )
                            Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                        if ( p->timeToStop && Abc_Clock() > p->timeToStop )
                            Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
                        else if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
                            Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
                        else if ( p->timeToStopOne && Abc_Clock() > p->timeToStopOne )
                        {
                            Pdr_QueueClean( p );
                            pCube = NULL;
                            break; // keep solving
                        }
                        else if ( p->pPars->nConfLimit )
                            Abc_Print( 1, "Reached conflict limit (%d) in frame %d.\n",  p->pPars->nConfLimit, iFrame );
                        else if ( p->pPars->fVerbose )
                            Abc_Print( 1, "Computation cancelled by the callback in frame %d.\n", iFrame );
                        p->pPars->iFrame = iFrame;
                        return -1;
                    }
                    if ( RetValue == 0 )
                    {
                        if ( fPrintClauses )
                        {
                            Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
                            Pdr_ManPrintClauses( p, 0 );
                        }
                        if ( p->pPars->fVerbose && !p->pPars->fUseAbs )
                            Pdr_ManPrintProgress( p, !p->pPars->fSolveAll, Abc_Clock() - clkStart );
                        p->pPars->iFrame = iFrame;
                        if ( !p->pPars->fSolveAll )
                        {
                            abctime clk = Abc_Clock();
                            Abc_Cex_t * pCex = Pdr_ManDeriveCexAbs(p);
                            p->tAbs += Abc_Clock() - clk;
                            if ( pCex == NULL )
                            {
                                assert( p->pPars->fUseAbs );
                                Pdr_QueueClean( p );
                                pCube = NULL;
                                fRefined = 1;
                                break; // keep solving
                            }
                            p->pAig->pSeqModel = pCex;

                            if ( p->pPars->fVerbose && p->pPars->fUseAbs )
                                Pdr_ManPrintProgress( p, !p->pPars->fSolveAll, Abc_Clock() - clkStart );
                            return 0; // SAT
                        }
                        p->pPars->nFailOuts++;
                        pCexNew = (p->pPars->fUseBridge || p->pPars->fStoreCex) ? Pdr_ManDeriveCex(p) : (Abc_Cex_t *)(ABC_PTRINT_T)1;
                        if ( p->pPars->vOutMap ) Vec_IntWriteEntry( p->pPars->vOutMap, p->iOutCur, 0 );
                        assert( Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL );
                        if ( p->pPars->fUseBridge )
                            Gia_ManToBridgeResult( stdout, 0, pCexNew, pCexNew->iPo );
                        Vec_PtrWriteEntry( p->vCexes, p->iOutCur, pCexNew );
                        if ( p->pPars->pFuncOnFail && p->pPars->pFuncOnFail(p->iOutCur, p->pPars->fStoreCex ? (Abc_Cex_t *)Vec_PtrEntry(p->vCexes, p->iOutCur) : NULL) )
                        {
                            if ( p->pPars->fVerbose )
                                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                            if ( !p->pPars->fSilent )
                                Abc_Print( 1, "Quitting due to callback on fail in frame %d.\n", iFrame );
                            p->pPars->iFrame = iFrame;
                            return -1;
                        }
                        if ( !p->pPars->fNotVerbose )
                            Abc_Print( 1, "Output %*d was asserted in frame %2d (%2d) (solved %*d out of %*d outputs).\n",
                                nOutDigits, p->iOutCur, iFrame, iFrame, nOutDigits, p->pPars->nFailOuts, nOutDigits, Saig_ManPoNum(p->pAig) );
                        if ( p->pPars->nFailOuts == Saig_ManPoNum(p->pAig) )
                            return 0; // all SAT
                        Pdr_QueueClean( p );
                        pCube = NULL;
                        break; // keep solving
                    }
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 0, Abc_Clock() - clkStart );
                }
            }
            if ( fRefined )
                break;
            if ( p->pTime4Outs )
            {
                abctime timeSince = Abc_Clock() - clkOne;
                assert( p->pTime4Outs[p->iOutCur] > 0 );
                p->pTime4Outs[p->iOutCur] = (p->pTime4Outs[p->iOutCur] > timeSince) ? p->pTime4Outs[p->iOutCur] - timeSince : 0;
                if ( p->pTime4Outs[p->iOutCur] == 0 && Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL ) // undecided
                {
                    p->pPars->nDropOuts++;
                    if ( p->pPars->vOutMap ) 
                        Vec_IntWriteEntry( p->pPars->vOutMap, p->iOutCur, -1 );
                    if ( !p->pPars->fNotVerbose ) 
                        Abc_Print( 1, "Timing out on output %*d in frame %d.\n", nOutDigits, p->iOutCur, iFrame );
                }
                p->timeToStopOne = 0;
            }
        }
        /*
        if ( p->pPars->fUseAbs && p->vAbsFlops && !fRefined )
        {
            int i, Used;
            Vec_IntForEachEntry( p->vAbsFlops, Used, i )
                if ( Used && (Vec_IntEntry(p->vPrio, i) >> p->nPrioShift) == 0 )
                    Vec_IntWriteEntry( p->vAbsFlops, i, 0 );
        }
        */
        if ( p->pPars->fUseAbs && p->vAbsFlops && !fRefined )
        {
            Pdr_Set_t * pSet;
            int i, j, k;
            Vec_IntFill( p->vAbsFlops, Vec_IntSize( p->vAbsFlops ), 0 );
            Vec_VecForEachEntry( Pdr_Set_t *, p->vClauses, pSet, i, j )
                for ( k = 0; k < pSet->nLits; k++ )
                    Vec_IntWriteEntry( p->vAbsFlops, Abc_Lit2Var(pSet->Lits[k]), 1 );
        }

        if ( p->pPars->fVerbose )
            Pdr_ManPrintProgress( p, !fRefined, Abc_Clock() - clkStart );
        if ( fRefined )
            continue;
        //if ( p->pPars->fUseAbs && p->vAbsFlops )
        //    printf( "Finished frame %d with %d (%d) flops.\n", iFrame, Vec_IntCountPositive(p->vAbsFlops), Vec_IntCountPositive(p->vPrio) );
        // open a new timeframe
        p->nQueLim = p->pPars->nRestLimit;
        assert( pCube == NULL );
        Pdr_ManSetPropertyOutput( p, iFrame );
        Pdr_ManCreateSolver( p, ++iFrame );
        if ( fPrintClauses )
        {
            Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
            Pdr_ManPrintClauses( p, 0 );
        }
        // push clauses into this timeframe
        RetValue = Pdr_ManPushClauses( p );
        if ( RetValue == -1 )
        {
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
            {
                if ( p->timeToStop && Abc_Clock() > p->timeToStop )
                    Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
                else
                    Abc_Print( 1, "Reached conflict limit (%d) in frame.\n",  p->pPars->nConfLimit, iFrame );
            }
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( RetValue )
        {
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Pdr_ManReportInvariant( p );
            if ( !p->pPars->fSilent )
                Pdr_ManVerifyInvariant( p );
            p->pPars->iFrame = iFrame;
            // count the number of UNSAT outputs
            p->pPars->nProveOuts = Saig_ManPoNum(p->pAig) - p->pPars->nFailOuts - p->pPars->nDropOuts;
            // convert previously 'unknown' into 'unsat'
            if ( p->pPars->vOutMap )
                for ( iFrame = 0; iFrame < Saig_ManPoNum(p->pAig); iFrame++ )
                    if ( Vec_IntEntry(p->pPars->vOutMap, iFrame) == -2 ) // unknown
                    {
                        Vec_IntWriteEntry( p->pPars->vOutMap, iFrame, 1 ); // unsat
                        if ( p->pPars->fUseBridge )
                            Gia_ManToBridgeResult( stdout, 1, NULL, iFrame );
                    }
            if ( p->pPars->nProveOuts == Saig_ManPoNum(p->pAig) )
                return 1; // UNSAT
            if ( p->pPars->nFailOuts > 0 )
                return 0; // SAT
            return -1;
        }
        if ( p->pPars->fVerbose )
            Pdr_ManPrintProgress( p, 0, Abc_Clock() - clkStart );

        // check termination
        if ( p->pPars->pFuncStop && p->pPars->pFuncStop(p->pPars->RunId) )
        {
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( p->timeToStop && Abc_Clock() > p->timeToStop )
        {
            if ( fPrintClauses )
            {
                Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
                Pdr_ManPrintClauses( p, 0 );
            }
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
        {
            if ( fPrintClauses )
            {
                Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
                Pdr_ManPrintClauses( p, 0 );
            }
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( p->pPars->nFrameMax && iFrame >= p->pPars->nFrameMax )
        {
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Abc_Print( 1, "Reached limit on the number of timeframes (%d).\n", p->pPars->nFrameMax );
            p->pPars->iFrame = iFrame;
            return -1;
        }
    }
    assert( 0 );
    return -1;
}